

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Xor_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  undefined4 local_48;
  undefined4 local_44;
  int32 nRight;
  int32 nLeft;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  undefined8 local_10;
  
  bVar1 = TaggedInt::Is(aLeft);
  if (bVar1) {
    local_44 = TaggedInt::ToInt32(aLeft);
  }
  else {
    local_44 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  }
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    local_48 = TaggedInt::ToInt32(aRight);
  }
  else {
    local_48 = JavascriptConversion::ToInt32(aRight,scriptContext);
  }
  local_44 = local_44 ^ local_48;
  bVar1 = TaggedInt::IsOverflow(local_44);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)(int)local_44,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(local_44);
  }
  return local_10;
}

Assistant:

Var JavascriptMath::Xor_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Xor_Full);
            int32 nLeft = TaggedInt::Is(aLeft) ? TaggedInt::ToInt32(aLeft) : JavascriptConversion::ToInt32(aLeft, scriptContext);
            int32 nRight = TaggedInt::Is(aRight) ? TaggedInt::ToInt32(aRight) : JavascriptConversion::ToInt32(aRight, scriptContext);

            return JavascriptNumber::ToVar(nLeft ^ nRight,scriptContext);
            JIT_HELPER_END(Op_Xor_Full);
        }